

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCubeCase::createAndUploadTexture
          (TextureGatherCubeCase *this)

{
  TextureCube *pTVar1;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *pvVar2;
  ostringstream *this_00;
  RenderContext *context;
  TestLog *pTVar3;
  PtrData<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> data;
  TextureGatherCubeCase *pTVar4;
  int iVar5;
  deUint32 internalFormat;
  CubeFace CVar6;
  undefined4 extraout_var;
  TextureCube *pTVar7;
  ulong uVar8;
  size_t __n;
  void *__buf;
  void *__buf_00;
  CubeFace face;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *pvVar9;
  long lVar10;
  int levelNdx;
  long lVar11;
  long lVar12;
  ConstPixelBufferAccess *access;
  long lVar13;
  uint local_308;
  CubeFace cubeFace;
  undefined8 local_300;
  TextureCube *local_2f8;
  TextureCube *local_2f0;
  TextureCube *local_2e8;
  TextureGatherCubeCase *local_2e0;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_2d8;
  CubeFace local_2cc;
  MovePtr<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> *local_2c8;
  long local_2c0;
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  TextureFormatInfo texFmtInfo;
  MessageBuilder local_1b0;
  
  local_2f8 = (TextureCube *)
              ((this->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  context = ((this->super_TextureGatherCase).super_TestCase.m_context)->m_renderCtx;
  iVar5 = (*context->_vptr_RenderContext[3])(context);
  local_2c0 = CONCAT44(extraout_var,iVar5);
  tcu::getTextureFormatInfo(&texFmtInfo,&(this->super_TextureGatherCase).m_textureFormat);
  pTVar7 = (TextureCube *)operator_new(0x180);
  internalFormat = glu::getInternalFormat((this->super_TextureGatherCase).m_textureFormat);
  glu::TextureCube::TextureCube(pTVar7,context,internalFormat,this->m_textureSize);
  local_1b0.m_log = (TestLog *)0x0;
  local_2c8 = &this->m_texture;
  data.ptr._4_4_ = cubeFace;
  data.ptr._0_4_ = local_308;
  data._8_4_ = (int)local_300;
  data._12_4_ = local_300._4_4_;
  de::details::UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::assignData
            (&local_2c8->super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>,
             data);
  de::details::UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>::~UniqueBase
            ((UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_> *)&local_1b0);
  local_2f0 = (this->m_texture).
              super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>.m_data.ptr;
  local_308 = (this->super_TextureGatherCase).m_baseLevel;
  if (((this->super_TextureGatherCase).m_minFilter - NEAREST_MIPMAP_NEAREST < 4) &&
     (((this->super_TextureGatherCase).m_flags & 1) == 0)) {
    uVar8 = ((long)(local_2f0->m_refTexture).m_access[0].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_2f0->m_refTexture).m_access[0].
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  }
  else {
    uVar8 = (ulong)(local_308 + 1);
  }
  local_300._0_4_ = (int)uVar8;
  local_300._4_4_ = (undefined4)(uVar8 >> 0x20);
  local_2e8 = &local_2f0->m_refTexture;
  local_2d8 = (local_2f0->m_refTexture).m_access;
  local_2e0 = this;
  while( true ) {
    pTVar4 = local_2e0;
    pTVar7 = local_2f0;
    __n = (size_t)local_308;
    if ((int)local_300 <= (int)local_308) break;
    de::toString<int>(&local_290,(int *)&local_308);
    std::operator+(&local_2b0,"InputTextureLevel",&local_290);
    de::toString<int>(&local_270,(int *)&local_308);
    std::operator+(&local_210,"Input texture, level ",&local_270);
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_1b0,&local_2b0,&local_210);
    tcu::LogImageSet::write((LogImageSet *)&local_1b0,(int)local_2f8,__buf,__n);
    tcu::LogImageSet::~LogImageSet((LogImageSet *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
    for (face = CUBEFACE_NEGATIVE_X; pTVar1 = local_2f8, face != CUBEFACE_LAST;
        face = face + CUBEFACE_POSITIVE_X) {
      cubeFace = face;
      tcu::TextureCube::allocLevel(local_2e8,face,local_308);
      pTVar4 = local_2e0;
      access = (ConstPixelBufferAccess *)
               ((long)(int)local_308 * 0x28 +
               *(long *)&local_2d8[cubeFace].
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         ._M_impl.super__Vector_impl_data);
      CVar6 = tcu::CommandLine::getBaseSeed
                        (((local_2e0->super_TextureGatherCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx)->m_cmdLine);
      fillWithRandomColorTiles
                ((PixelBufferAccess *)access,&texFmtInfo.valueMin,&texFmtInfo.valueMax,CVar6 ^ face)
      ;
      pTVar3 = ((pTVar4->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
      de::toString<int>(&local_270,(int *)&local_308);
      std::operator+(&local_210,"InputTextureLevel",&local_270);
      std::operator+(&local_290,&local_210,"Face");
      local_2cc = cubeFace;
      de::toString<int>(&local_230,(int *)&local_2cc);
      std::operator+(&local_2b0,&local_290,&local_230);
      de::toString<tcu::CubeFace>(&local_250,&cubeFace);
      tcu::LogImage::LogImage
                ((LogImage *)&local_1b0,&local_2b0,&local_250,access,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)&local_1b0,(int)pTVar3,__buf_00,(size_t)access);
      tcu::LogImage::~LogImage((LogImage *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_270);
    }
    tcu::TestLog::endImageSet((TestLog *)local_2f8);
    local_1b0.m_log = (TestLog *)pTVar1;
    this_00 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,"Note: texture level\'s size is ");
    std::ostream::operator<<
              (this_00,*(int *)((long)(local_2d8->
                                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 8 +
                               (long)(int)local_308 * 0x28));
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
    local_308 = local_308 + 1;
  }
  pTVar1 = &local_2e0->m_swizzledTexture;
  tcu::TextureCube::TextureCube
            ((TextureCube *)&local_1b0,&local_2e8->m_format,(local_2f0->m_refTexture).m_size);
  local_2f8 = pTVar1;
  tcu::TextureCube::operator=(pTVar1,(TextureCube *)&local_1b0);
  local_300 = &(pTVar4->super_TextureGatherCase).m_textureSwizzle;
  tcu::TextureCube::~TextureCube((TextureCube *)&local_1b0);
  local_2b8 = (pTVar7->m_refTexture).m_data;
  local_2e0 = (TextureGatherCubeCase *)(pTVar4->m_swizzledTexture).m_access;
  for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
    pvVar2 = local_2b8 + lVar10;
    local_2e8 = (TextureCube *)((long)local_2e0 + lVar10 * 0x18);
    pvVar9 = local_2d8 + lVar10;
    lVar12 = 8;
    lVar13 = 0;
    lVar11 = 0;
    while( true ) {
      if ((int)(((long)(pTVar7->m_refTexture).m_access[0].
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar7->m_refTexture).m_access[0].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= lVar11) break;
      if (*(long *)((long)(pvVar2->
                          super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar12) != 0) {
        tcu::TextureCube::allocLevel(local_2f8,(CubeFace)lVar10,(int)lVar11);
        swizzlePixels((PixelBufferAccess *)
                      ((long)(((((_Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                  *)&local_2e8->m_format)->_M_impl).super__Vector_impl_data._M_start
                              )->super_ConstPixelBufferAccess).m_size.m_data + lVar13 + -8),
                      (ConstPixelBufferAccess *)
                      (*(long *)&(pvVar9->
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 )._M_impl.super__Vector_impl_data + lVar13),local_300);
        pTVar7 = local_2f0;
      }
      lVar11 = lVar11 + 1;
      lVar13 = lVar13 + 0x28;
      lVar12 = lVar12 + 0x10;
    }
  }
  (**(code **)(local_2c0 + 8))(0x84c0);
  glu::TextureCube::upload
            ((local_2c8->super_UniqueBase<glu::TextureCube,_de::DefaultDeleter<glu::TextureCube>_>).
             m_data.ptr);
  return;
}

Assistant:

void TextureGatherCubeCase::createAndUploadTexture (void)
{
	TestLog&						log			= m_testCtx.getLog();
	const glu::RenderContext&		renderCtx	= m_context.getRenderContext();
	const glw::Functions&			gl			= renderCtx.getFunctions();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_textureFormat);

	m_texture = MovePtr<glu::TextureCube>(new glu::TextureCube(renderCtx, glu::getInternalFormat(m_textureFormat), m_textureSize));

	{
		tcu::TextureCube&	refTexture	= m_texture->getRefTexture();
		const int			levelBegin	= m_baseLevel;
		const int			levelEnd	= isMipmapFilter(m_minFilter) && !(m_flags & GATHERCASE_MIPMAP_INCOMPLETE) ? refTexture.getNumLevels() : m_baseLevel+1;
		DE_ASSERT(m_baseLevel < refTexture.getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			log << TestLog::ImageSet("InputTextureLevel" + de::toString(levelNdx), "Input texture, level " + de::toString(levelNdx));

			for (int cubeFaceI = 0; cubeFaceI < tcu::CUBEFACE_LAST; cubeFaceI++)
			{
				const tcu::CubeFace			cubeFace	= (tcu::CubeFace)cubeFaceI;
				refTexture.allocLevel(cubeFace, levelNdx);
				const PixelBufferAccess&	levelFace	= refTexture.getLevelFace(levelNdx, cubeFace);
				fillWithRandomColorTiles(levelFace, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_testCtx.getCommandLine().getBaseSeed() ^ (deUint32)cubeFaceI);

				m_testCtx.getLog() << TestLog::Image("InputTextureLevel" + de::toString(levelNdx) + "Face" + de::toString((int)cubeFace),
													 de::toString(cubeFace),
													 levelFace);
			}

			log << TestLog::EndImageSet
				<< TestLog::Message << "Note: texture level's size is " << refTexture.getLevelFace(levelNdx, tcu::CUBEFACE_NEGATIVE_X).getWidth() << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, refTexture, m_textureSwizzle);
	}

	gl.activeTexture(GL_TEXTURE0);
	m_texture->upload();
}